

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_packet.c
# Opt level: O3

int pt_pkt_read_ip(pt_packet_ip *packet,uint8_t *pos,pt_config *config)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  pt_ip_compression pVar6;
  uint uVar7;
  
  if (config == (pt_config *)0x0 || (pos == (uint8_t *)0x0 || packet == (pt_packet_ip *)0x0)) {
    return -1;
  }
  pVar6 = (pt_ip_compression)(*pos >> 5);
  uVar7 = 0xfffffffb;
  if (pt_ipc_full < pVar6) {
    return -5;
  }
  pbVar5 = pos + 1;
  switch(pVar6) {
  case pt_ipc_suppressed:
    if (config->end < pbVar5) {
      return -7;
    }
    uVar7 = 1;
    uVar4 = 0;
    goto LAB_0010df29;
  case pt_ipc_update_16:
    uVar2 = 2;
    break;
  case pt_ipc_update_32:
    uVar2 = 4;
    break;
  default:
    uVar2 = 6;
    break;
  case pt_ipc_update_48|pt_ipc_update_16:
    goto switchD_0010debd_caseD_5;
  case pt_ipc_full:
    uVar2 = 8;
  }
  uVar7 = 0xfffffff9;
  if (pbVar5 + uVar2 <= config->end) {
    uVar3 = 0;
    uVar4 = 0;
    do {
      bVar1 = *pbVar5;
      pbVar5 = pbVar5 + 1;
      uVar4 = uVar4 | (ulong)bVar1 << ((byte)uVar3 & 0x3f);
      uVar3 = uVar3 + 8;
    } while (uVar2 * 8 != uVar3);
    uVar7 = uVar2 | 1;
LAB_0010df29:
    packet->ipc = pVar6;
    packet->ip = uVar4;
  }
switchD_0010debd_caseD_5:
  return uVar7;
}

Assistant:

int pt_pkt_read_ip(struct pt_packet_ip *packet, const uint8_t *pos,
		   const struct pt_config *config)
{
	uint64_t ip;
	uint8_t ipc;
	int ipsize;

	if (!packet || !pos || !config)
		return -pte_internal;

	ipc = (*pos++ >> pt_opm_ipc_shr) & pt_opm_ipc_shr_mask;

	ip = 0ull;
	ipsize = pt_pkt_ip_size((enum pt_ip_compression) ipc);
	if (ipsize < 0)
		return ipsize;

	if (config->end < pos + ipsize)
		return -pte_eos;

	if (ipsize)
		ip = pt_pkt_read_value(pos, ipsize);

	packet->ipc = (enum pt_ip_compression) ipc;
	packet->ip = ip;

	return ipsize + 1;
}